

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

MapIterator * __thiscall
google::protobuf::Reflection::MapEnd
          (MapIterator *__return_storage_ptr__,Reflection *this,Message *message,
          FieldDescriptor *field)

{
  LogMessage *other;
  LogFinisher local_59;
  LogMessage local_58;
  
  internal::LogMessage::LogMessage
            (&local_58,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
             ,0xef);
  other = internal::LogMessage::operator<<(&local_58,"Unimplemented Map Reflection API.");
  internal::LogFinisher::operator=(&local_59,other);
  internal::LogMessage::~LogMessage(&local_58);
  MapIterator::MapIterator(__return_storage_ptr__,message,field);
  return __return_storage_ptr__;
}

Assistant:

MapIterator Reflection::MapEnd(
    Message* message,
    const FieldDescriptor* field) const {
  GOOGLE_LOG(FATAL) << "Unimplemented Map Reflection API.";
  MapIterator iter(message, field);
  return iter;
}